

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::Parse(Parser *this,string *fn)

{
  bool condition;
  int iVar1;
  clock_t cVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  clock_t cVar5;
  TiXmlElement *pTVar6;
  Parser *this_00;
  TiXmlHandle xml_handle;
  string msg;
  TiXmlDocument doc;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  TiXmlDocument local_a0;
  
  std::__cxx11::string::_M_assign((string *)this);
  cVar2 = clock();
  util::tinyxml::TiXmlDocument::TiXmlDocument(&local_a0,(this->file_name_)._M_dataplus._M_p);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Loading file ");
      poVar4 = std::operator<<(poVar4,(string *)this);
      std::operator<<(poVar4,"...");
    }
  }
  condition = util::tinyxml::TiXmlDocument::LoadFile(&local_a0,TIXML_ENCODING_UNKNOWN);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Done [");
      cVar5 = clock();
      poVar4 = std::ostream::_M_insert<double>((double)(cVar5 - cVar2) / 1000000.0);
      poVar4 = std::operator<<(poVar4,"s]");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  to_string<int>(&local_100,local_a0.errorLocation.row + 1);
  std::operator+(&local_e0,"Could not load pomdpX file.\n  Line",&local_100);
  std::operator+(&local_140,&local_e0,":");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,(local_a0.errorDesc.rep_)->str,&local_181);
  std::operator+(&local_180,&local_140,&local_120);
  std::operator+(&local_160,&local_180,"\n");
  std::operator+(&local_c0,&local_160,
                 "  Check pomdpX file with pomdpX\'s XML schema using an XML validator.\n");
  Ensure(this,condition,&local_c0,(TiXmlBase *)0x0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  local_180._M_dataplus._M_p = (pointer)&local_a0;
  util::tinyxml::TiXmlHandle::FirstChildElement((TiXmlHandle *)&local_160);
  pTVar6 = util::tinyxml::TiXmlHandle::ToElement((TiXmlHandle *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,((pTVar6->super_TiXmlNode).value.rep_)->str,
             (allocator<char> *)&local_140);
  cVar2 = clock();
  this_00 = this;
  ParseDiscountTag(this,(TiXmlHandle *)&local_180);
  ParseHorizonTag(this_00,(TiXmlHandle *)&local_180);
  ParseHasTerminalTag(this,(TiXmlHandle *)&local_180);
  ParseVariableTag(this,(TiXmlHandle *)&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Parsing terminal tag...");
    }
  }
  ParseTerminalStateTag(this,(TiXmlHandle *)&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Done.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Parsing initial belief...");
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseInitialBeliefTag(this,(TiXmlHandle *)&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Done.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Parsing transitions...");
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseStateTransitionTag(this,(TiXmlHandle *)&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Done.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Parsing obs function...");
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseObsFunctionTag(this,(TiXmlHandle *)&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Done.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Parsing reward function...");
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      logging::stream(3);
      std::ostream::flush();
    }
  }
  ParseRewardFunctionTag(this,(TiXmlHandle *)&local_180);
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,"Done.");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  iVar1 = logging::level();
  if (0 < iVar1) {
    iVar1 = logging::level();
    if (2 < iVar1) {
      plVar3 = logging::stream(3);
      std::operator<<(&plVar3->super_ostream,"Parsing done in ");
      cVar5 = clock();
      poVar4 = std::ostream::_M_insert<double>((double)(cVar5 - cVar2) / 1000000.0);
      poVar4 = std::operator<<(poVar4,"s");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  std::__cxx11::string::~string((string *)&local_160);
  util::tinyxml::TiXmlDocument::~TiXmlDocument(&local_a0);
  return;
}

Assistant:

void Parser::Parse(string fn) {
	file_name_ = fn;

	clock_t start = clock();
	TiXmlDocument doc(file_name_.c_str());

	// Load file
	logi << "Loading file " << file_name_ << "...";
	bool loadOkay = doc.LoadFile();
	logi << "Done [" << double(clock() - start) / CLOCKS_PER_SEC << "s]"
		<< endl;

	Ensure(loadOkay,
		"Could not load pomdpX file.\n  Line" + to_string(doc.ErrorRow()) + ":"
			+ string(doc.ErrorDesc()) + "\n"
			+ "  Check pomdpX file with pomdpX's XML schema using an XML validator.\n");

	TiXmlHandle xml_handle(&doc);
	TiXmlElement *elem = xml_handle.FirstChildElement().ToElement();
	string msg = elem->Value();

	start = clock();
	// Parse all the tags
	ParseDiscountTag(xml_handle);
	ParseHorizonTag(xml_handle);
	ParseHasTerminalTag(xml_handle);
	ParseVariableTag(xml_handle);
	logi << "Parsing terminal tag...";
	ParseTerminalStateTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing initial belief...";
	logi.flush();
	ParseInitialBeliefTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing transitions...";
	logi.flush();
	ParseStateTransitionTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing obs function...";
	logi.flush();
	ParseObsFunctionTag(xml_handle);
	logi << "Done." << endl;
	logi << "Parsing reward function...";
	logi.flush();
	ParseRewardFunctionTag(xml_handle);
	logi << "Done." << endl;
	// cout << "Parsing terminal state reward" << endl;
	// ParseTerminalStateRewardTag(xml_handle);
	// ReadBounds();
	logi << "Parsing done in " << double(clock() - start) / CLOCKS_PER_SEC
		<< "s" << endl;
}